

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

uint char_othercase(compiler_common *common,uint c)

{
  uint local_18;
  uint c_local;
  compiler_common *common_local;
  
  local_18 = c;
  if (c < 0x100) {
    local_18 = (uint)common->fcc[c];
  }
  return local_18;
}

Assistant:

static SLJIT_INLINE unsigned int char_othercase(compiler_common *common, unsigned int c)
{
/* Returns with the othercase. */
#ifdef SUPPORT_UNICODE
if (common->utf && c > 127)
  {
  return UCD_OTHERCASE(c);
  }
#endif
return TABLE_GET(c, common->fcc, c);
}